

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InMemMsgLoader.cpp
# Opt level: O3

void __thiscall xercesc_4_0::InMemMsgLoader::InMemMsgLoader(InMemMsgLoader *this,XMLCh *msgDomain)

{
  short *psVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  long lVar4;
  short *psVar5;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  size_t __n;
  
  (this->super_XMLMsgLoader)._vptr_XMLMsgLoader = (_func_int **)&PTR__InMemMsgLoader_0040fae8;
  this->fMsgDomain = (XMLCh *)0x0;
  if (msgDomain != L"http://apache.org/xml/messages/XMLErrors") {
    if (msgDomain == (XMLCh *)0x0) {
      psVar5 = &XMLUni::fgXMLErrDomain;
LAB_0033f418:
      if ((msgDomain != L"http://apache.org/xml/messages/XML4CErrors") && (*psVar5 != 0))
      goto LAB_0033f42f;
    }
    else {
      lVar4 = 0;
      do {
        psVar5 = (short *)((long)msgDomain + lVar4);
        if (*psVar5 == 0) {
          psVar5 = (short *)((long)&XMLUni::fgXMLErrDomain + lVar4);
          goto LAB_0033f418;
        }
        psVar1 = (short *)((long)&XMLUni::fgXMLErrDomain + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar5 == *psVar1);
      if (msgDomain == L"http://apache.org/xml/messages/XML4CErrors") goto LAB_0033f516;
LAB_0033f42f:
      if (msgDomain == (XMLCh *)0x0) {
        psVar5 = &XMLUni::fgExceptDomain;
LAB_0033f472:
        if ((msgDomain == L"http://apache.org/xml/messages/XMLDOMMsg") || (*psVar5 == 0))
        goto LAB_0033f511;
      }
      else {
        lVar4 = 0;
        do {
          psVar5 = (short *)((long)msgDomain + lVar4);
          if (*psVar5 == 0) {
            psVar5 = (short *)((long)&XMLUni::fgExceptDomain + lVar4);
            goto LAB_0033f472;
          }
          psVar1 = (short *)((long)&XMLUni::fgExceptDomain + lVar4);
          lVar4 = lVar4 + 2;
        } while (*psVar5 == *psVar1);
        if (msgDomain == L"http://apache.org/xml/messages/XMLDOMMsg") goto LAB_0033f516;
      }
      if (msgDomain == (XMLCh *)0x0) {
        psVar5 = &XMLUni::fgXMLDOMMsgDomain;
LAB_0033f4c9:
        if ((msgDomain == L"http://apache.org/xml/messages/XMLValidity") || (*psVar5 == 0))
        goto LAB_0033f511;
      }
      else {
        lVar4 = 0;
        do {
          psVar5 = (short *)((long)msgDomain + lVar4);
          if (*psVar5 == 0) {
            psVar5 = (short *)((long)&XMLUni::fgXMLDOMMsgDomain + lVar4);
            goto LAB_0033f4c9;
          }
          psVar1 = (short *)((long)&XMLUni::fgXMLDOMMsgDomain + lVar4);
          lVar4 = lVar4 + 2;
        } while (*psVar5 == *psVar1);
        if (msgDomain == L"http://apache.org/xml/messages/XMLValidity") goto LAB_0033f516;
      }
      pXVar6 = L"http://apache.org/xml/messages/XMLValidity";
      pXVar7 = msgDomain;
      if (msgDomain == (XMLCh *)0x0) {
LAB_0033f501:
        if (*pXVar6 == L'\0') goto LAB_0033f511;
      }
      else {
        do {
          XVar2 = *pXVar7;
          if (XVar2 == L'\0') goto LAB_0033f501;
          XVar3 = *pXVar6;
          pXVar6 = pXVar6 + 1;
          pXVar7 = pXVar7 + 1;
        } while (XVar2 == XVar3);
      }
      XMLPlatformUtils::panic(Panic_UnknownMsgDomain);
    }
LAB_0033f511:
    if (msgDomain == (XMLCh *)0x0) {
      pXVar6 = (XMLCh *)0x0;
      goto LAB_0033f549;
    }
  }
LAB_0033f516:
  __n = 0;
  do {
    psVar5 = (short *)((long)msgDomain + __n);
    __n = __n + 2;
  } while (*psVar5 != 0);
  pXVar6 = (XMLCh *)(**(code **)(*XMLPlatformUtils::fgMemoryManager + 0x18))
                              (XMLPlatformUtils::fgMemoryManager,__n);
  memcpy(pXVar6,msgDomain,__n);
LAB_0033f549:
  this->fMsgDomain = pXVar6;
  return;
}

Assistant:

InMemMsgLoader::InMemMsgLoader(const XMLCh* const msgDomain)
:fMsgDomain(0)
{
    if (!XMLString::equals(msgDomain, XMLUni::fgXMLErrDomain)
    &&  !XMLString::equals(msgDomain, XMLUni::fgExceptDomain)
    &&  !XMLString::equals(msgDomain, XMLUni::fgXMLDOMMsgDomain)
    &&  !XMLString::equals(msgDomain, XMLUni::fgValidityDomain))
    {
        XMLPlatformUtils::panic(PanicHandler::Panic_UnknownMsgDomain);
    }

    fMsgDomain = XMLString::replicate(msgDomain, XMLPlatformUtils::fgMemoryManager);
}